

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O0

int flute_wl(int d,int *x,int *y,int acc)

{
  point *ppVar1;
  int local_1360;
  int local_135c;
  int local_1358;
  int local_1354;
  int local_1350;
  int local_134c;
  int local_1348;
  int local_1344;
  int local_1340;
  int local_133c;
  int local_1334;
  point *tmpp;
  point *ptp [150];
  point pt [150];
  int local_768;
  int minidx;
  int k;
  int j;
  int i;
  int s [150];
  int yl;
  int yu;
  int xl;
  int xu;
  int l;
  int minval;
  int ys [150];
  int local_288 [2];
  int xs [150];
  int acc_local;
  int *y_local;
  int *x_local;
  int d_local;
  
  if (d == 2) {
    if (x[1] < *x) {
      local_1334 = *x - x[1];
    }
    else {
      local_1334 = x[1] - *x;
    }
    if (y[1] < *y) {
      local_133c = *y - y[1];
    }
    else {
      local_133c = y[1] - *y;
    }
    xl = local_1334 + local_133c;
  }
  else if (d == 3) {
    if (x[1] < *x) {
      if (x[2] < *x) {
        local_1340 = *x;
      }
      else {
        local_1340 = x[2];
      }
      yu = local_1340;
      if (x[1] < x[2]) {
        local_1344 = x[1];
      }
      else {
        local_1344 = x[2];
      }
      yl = local_1344;
    }
    else {
      if (x[2] < x[1]) {
        local_1348 = x[1];
      }
      else {
        local_1348 = x[2];
      }
      yu = local_1348;
      if (*x < x[2]) {
        local_134c = *x;
      }
      else {
        local_134c = x[2];
      }
      yl = local_134c;
    }
    if (y[1] < *y) {
      if (y[2] < *y) {
        local_1350 = *y;
      }
      else {
        local_1350 = y[2];
      }
      s[0x95] = local_1350;
      if (y[1] < y[2]) {
        local_1354 = y[1];
      }
      else {
        local_1354 = y[2];
      }
      s[0x94] = local_1354;
    }
    else {
      if (y[2] < y[1]) {
        local_1358 = y[1];
      }
      else {
        local_1358 = y[2];
      }
      s[0x95] = local_1358;
      if (*y < y[2]) {
        local_135c = *y;
      }
      else {
        local_135c = y[2];
      }
      s[0x94] = local_135c;
    }
    xl = (yu - yl) + (s[0x95] - s[0x94]);
  }
  else {
    for (k = 0; k < d; k = k + 1) {
      pt[(long)k + -1].y = x[k];
      pt[(long)k + -1].o = y[k];
      ptp[(long)k + -1] = (point *)&pt[(long)k + -1].y;
    }
    for (k = 0; k < d + -1; k = k + 1) {
      xu = ptp[(long)k + -1]->x;
      local_768 = k;
      minidx = k;
      while (minidx = minidx + 1, minidx < d) {
        if (ptp[(long)minidx + -1]->x < xu) {
          xu = ptp[(long)minidx + -1]->x;
          local_768 = minidx;
        }
      }
      ppVar1 = ptp[(long)k + -1];
      ptp[(long)k + -1] = ptp[(long)local_768 + -1];
      ptp[(long)local_768 + -1] = ppVar1;
    }
    for (k = 0; k < d; k = k + 1) {
      local_288[k] = ptp[(long)k + -1]->x;
      ptp[(long)k + -1]->o = k;
    }
    for (k = 0; k < d + -1; k = k + 1) {
      xu = ptp[(long)k + -1]->y;
      local_768 = k;
      minidx = k;
      while (minidx = minidx + 1, minidx < d) {
        if (ptp[(long)minidx + -1]->y < xu) {
          xu = ptp[(long)minidx + -1]->y;
          local_768 = minidx;
        }
      }
      (&l)[k] = ptp[(long)local_768 + -1]->y;
      (&j)[k] = ptp[(long)local_768 + -1]->o;
      ptp[(long)local_768 + -1] = ptp[(long)k + -1];
    }
    (&l)[d + -1] = ptp[(long)(d + -1) + -1]->y;
    (&j)[d + -1] = ptp[(long)(d + -1) + -1]->o;
    if (d < 10) {
      local_1360 = flutes_wl_LD(d,local_288,&l,&j);
    }
    else {
      local_1360 = flutes_wl_MD(d,local_288,&l,&j,acc);
    }
    xl = local_1360;
  }
  return xl;
}

Assistant:

DTYPE flute_wl(int d, DTYPE x[], DTYPE y[], int acc)
{
    DTYPE xs[MAXD], ys[MAXD], minval, l, xu, xl, yu, yl;
    int s[MAXD];
    int i, j, k, minidx;
    struct point pt[MAXD], *ptp[MAXD], *tmpp;

    if (d==2)
        l = ADIFF(x[0], x[1]) + ADIFF(y[0], y[1]);
    else if (d==3) {
        if (x[0] > x[1]) {
            xu = max(x[0], x[2]);
            xl = min(x[1], x[2]);
        }
        else {
            xu = max(x[1], x[2]);
            xl = min(x[0], x[2]);
        }
        if (y[0] > y[1]) {
            yu = max(y[0], y[2]);
            yl = min(y[1], y[2]);
        }
        else {
            yu = max(y[1], y[2]);
            yl = min(y[0], y[2]);
        }
        l = (xu-xl) + (yu-yl);
    }
    else {
        for (i=0; i<d; i++) {
            pt[i].x = x[i];
            pt[i].y = y[i];
            ptp[i] = &pt[i];
        }
        
        // sort x
        for (i=0; i<d-1; i++) {
            minval = ptp[i]->x;
            minidx = i;
            for (j=i+1; j<d; j++) {
                if (minval > ptp[j]->x) {
                    minval = ptp[j]->x;
                    minidx = j;
                }
            }
            tmpp = ptp[i];
            ptp[i] = ptp[minidx];
            ptp[minidx] = tmpp;
        }

#if REMOVE_DUPLICATE_PIN==1
        ptp[d] = &pt[d];
        ptp[d]->x = ptp[d]->y = -999999;
        j = 0;
        for (i=0; i<d; i++) {
            for (k=i+1; ptp[k]->x == ptp[i]->x; k++)
                if (ptp[k]->y == ptp[i]->y)  // pins k and i are the same
                    break;
            if (ptp[k]->x != ptp[i]->x)
                ptp[j++] = ptp[i];
        }
        d = j;
#endif
        
        for (i=0; i<d; i++) {
            xs[i] = ptp[i]->x;
            ptp[i]->o = i;
        }

        // sort y to find s[]
        for (i=0; i<d-1; i++) {
            minval = ptp[i]->y;
            minidx = i;
            for (j=i+1; j<d; j++) {
                if (minval > ptp[j]->y) {
                    minval = ptp[j]->y;
                    minidx = j;
                }
            }
            ys[i] = ptp[minidx]->y;
            s[i] = ptp[minidx]->o;
            ptp[minidx] = ptp[i];
        }
        ys[d-1] = ptp[d-1]->y;
        s[d-1] = ptp[d-1]->o;
        
        l = flutes_wl(d, xs, ys, s, acc);
    }
    return l;
}